

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall
sznet::net::EventLoopThread::EventLoopThread
          (EventLoopThread *this,ThreadInitCallback *cb,string *name)

{
  _Bind<void_(sznet::net::EventLoopThread::*(sznet::net::EventLoopThread_*))()> local_68;
  ThreadFunc local_50;
  
  this->m_loop = (EventLoop *)0x0;
  this->m_exiting = false;
  local_68._M_f = (offset_in_EventLoopThread_to_subr)threadFunc;
  local_68._8_8_ = 0;
  local_68._M_bound_args.super__Tuple_impl<0UL,_sznet::net::EventLoopThread_*>.
  super__Head_base<0UL,_sznet::net::EventLoopThread_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::EventLoopThread_*>)
       (_Tuple_impl<0UL,_sznet::net::EventLoopThread_*>)this;
  std::function<void()>::
  function<std::_Bind<void(sznet::net::EventLoopThread::*(sznet::net::EventLoopThread*))()>,void>
            ((function<void()> *)&local_50,&local_68);
  Thread::Thread(&this->m_thread,&local_50,name);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  MutexLock::MutexLock(&this->m_mutex);
  (this->m_cond).m_mutex = &this->m_mutex;
  sz_cond_init(&(this->m_cond).m_cond);
  std::function<void_(sznet::net::EventLoop_*)>::function(&this->m_callback,cb);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const ThreadInitCallback& cb, const string& name):
	m_loop(nullptr),
	m_exiting(false),
	m_thread(std::bind(&EventLoopThread::threadFunc, this), name),
	m_mutex(),
	m_cond(m_mutex),
	m_callback(cb)
{
}